

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-mmsg.c
# Opt level: O1

int run_test_udp_mmsg(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  void *pvVar4;
  long lVar5;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_udp_t *puVar6;
  uv_udp_t *puVar7;
  ulong in_R8;
  char *unaff_R12;
  void *unaff_R13;
  uv_udp_t *unaff_R14;
  int64_t eval_b;
  int64_t eval_b_6;
  int64_t eval_a;
  sockaddr_in addr;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  
  local_40._0_8_ = (uv_loop_t *)0x0;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_30);
  local_50._0_8_ = SEXT48(iVar1);
  if (local_40._0_8_ == local_50._0_8_) {
    local_40._0_8_ = (uv_loop_t *)0x0;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init_ex(uVar3,&recver,0x100);
    local_50._0_8_ = SEXT48(iVar1);
    if (local_40._0_8_ != local_50._0_8_) goto LAB_0018823c;
    local_40._0_8_ = (uv_loop_t *)0x0;
    iVar1 = uv_udp_bind(&recver,local_30,0);
    local_50._0_8_ = SEXT48(iVar1);
    if (local_40._0_8_ != local_50._0_8_) goto LAB_0018824b;
    local_40._0_8_ = (uv_loop_t *)0x0;
    iVar1 = uv_udp_recv_start(&recver,alloc_cb,recv_cb);
    local_50._0_8_ = SEXT48(iVar1);
    if (local_40._0_8_ != local_50._0_8_) goto LAB_0018825a;
    local_40._0_8_ = (uv_loop_t *)0x0;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_30);
    local_50._0_8_ = SEXT48(iVar1);
    if (local_40._0_8_ != local_50._0_8_) goto LAB_00188269;
    local_40._0_8_ = (uv_loop_t *)0x0;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init(uVar3,&sender);
    local_50._0_8_ = SEXT48(iVar1);
    if (local_40._0_8_ != local_50._0_8_) goto LAB_00188278;
    local_40 = uv_buf_init("PING",4);
    iVar1 = 8;
    unaff_R14 = &sender;
    do {
      local_50._0_8_ = (uv_loop_t *)0x4;
      iVar2 = uv_udp_try_send(&sender,local_40,1,local_30);
      local_50._8_8_ = SEXT48(iVar2);
      if (local_50._0_8_ != local_50._8_8_) {
        run_test_udp_mmsg_cold_7();
        goto LAB_0018822d;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    local_50._0_8_ = (uv_loop_t *)0x0;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    local_50._8_8_ = SEXT48(iVar1);
    if (local_50._0_8_ != local_50._8_8_) goto LAB_00188287;
    local_50._0_8_ = SEXT48(close_cb_called);
    local_50._8_8_ = (uv_loop_t *)0x2;
    if ((uv_loop_t *)local_50._0_8_ != (uv_loop_t *)0x2) goto LAB_00188296;
    local_50._0_8_ = SEXT48(recv_cb_called);
    local_50._8_8_ = (uv_loop_t *)0x8;
    if ((uv_loop_t *)local_50._0_8_ != (uv_loop_t *)0x8) goto LAB_001882a5;
    local_50._0_8_ = sender.send_queue_size;
    local_50._8_8_ = (uv_loop_t *)0x0;
    if (sender.send_queue_size != 0) goto LAB_001882b4;
    local_50._0_8_ = recver.send_queue_size;
    local_50._8_8_ = (uv_loop_t *)0x0;
    if (recver.send_queue_size != 0) goto LAB_001882c3;
    printf("%d allocs for %d recvs\n",(ulong)(uint)alloc_cb_called);
    iVar1 = uv_udp_using_recvmmsg(&recver);
    if (iVar1 != 0) {
      local_50._0_8_ = SEXT48(alloc_cb_called);
      local_50._8_8_ = (uv_loop_t *)0x2;
      if ((uv_loop_t *)local_50._0_8_ != (uv_loop_t *)0x2) {
        run_test_udp_mmsg_cold_13();
        goto LAB_001881ac;
      }
LAB_001881d4:
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001882d2;
    }
LAB_001881ac:
    local_50._0_8_ = SEXT48(alloc_cb_called);
    local_50._8_8_ = SEXT48(recv_cb_called);
    if (local_50._0_8_ == local_50._8_8_) goto LAB_001881d4;
  }
  else {
LAB_0018822d:
    run_test_udp_mmsg_cold_1();
LAB_0018823c:
    run_test_udp_mmsg_cold_2();
LAB_0018824b:
    run_test_udp_mmsg_cold_3();
LAB_0018825a:
    run_test_udp_mmsg_cold_4();
LAB_00188269:
    run_test_udp_mmsg_cold_5();
LAB_00188278:
    run_test_udp_mmsg_cold_6();
LAB_00188287:
    run_test_udp_mmsg_cold_8();
LAB_00188296:
    run_test_udp_mmsg_cold_9();
LAB_001882a5:
    run_test_udp_mmsg_cold_10();
LAB_001882b4:
    run_test_udp_mmsg_cold_11();
LAB_001882c3:
    run_test_udp_mmsg_cold_12();
LAB_001882d2:
    run_test_udp_mmsg_cold_15();
  }
  puVar7 = (uv_udp_t *)local_50;
  puVar6 = (uv_udp_t *)(local_50 + 8);
  run_test_udp_mmsg_cold_14();
  lVar5 = CONCAT71(0x55ed,puVar7 == &sender || puVar7 == &recver);
  if (puVar7 == &sender || puVar7 == &recver) {
    iVar1 = uv_udp_using_recvmmsg();
    unaff_R14 = (uv_udp_t *)0x40000;
    if (iVar1 == 0) {
      unaff_R14 = (uv_udp_t *)0x10000;
    }
    puVar7 = unaff_R14;
    pvVar4 = malloc((size_t)unaff_R14);
    *extraout_RDX = pvVar4;
    if (pvVar4 != (void *)0x0) {
      extraout_RDX[1] = unaff_R14;
      alloc_cb_called = alloc_cb_called + 1;
      return (int)pvVar4;
    }
  }
  else {
    alloc_cb_cold_1();
  }
  alloc_cb_cold_2();
  if ((long)puVar6 < 0) {
    recv_cb_cold_5();
LAB_00188463:
    recv_cb_cold_3();
    puVar6 = unaff_R14;
LAB_00188472:
    recv_cb_cold_1();
LAB_00188481:
    recv_cb_cold_4();
  }
  else {
    if ((in_R8 & 0x10) == 0) {
      unaff_R14 = puVar6;
      if (puVar6 != (uv_udp_t *)0x4) goto LAB_00188463;
      if (lVar5 != 0) {
        unaff_R13 = (void *)*extraout_RDX_00;
        unaff_R12 = "PING";
        iVar1 = bcmp("PING",unaff_R13,4);
        if (iVar1 == 0) {
          iVar1 = recv_cb_called + 1;
          recv_cb_called = iVar1;
          if (iVar1 == 8) {
            uv_close(puVar7,close_cb);
            iVar1 = uv_close(&sender,close_cb);
          }
          if ((in_R8 & 8) != 0) {
            return iVar1;
          }
          goto LAB_0018843e;
        }
        goto LAB_0018848e;
      }
      goto LAB_00188481;
    }
    if (puVar6 != (uv_udp_t *)0x0) goto LAB_00188472;
    if (lVar5 == 0) {
LAB_0018843e:
      free((void *)*extraout_RDX_00);
      return extraout_EAX;
    }
  }
  recv_cb_cold_2();
LAB_0018848e:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
          ,0x57,"\"PING\"","==","rcvbuf->base",puVar6,unaff_R12,"==",puVar6,unaff_R13);
  abort();
}

Assistant:

TEST_IMPL(udp_mmsg) {
  struct sockaddr_in addr;
  uv_buf_t buf;
  int i;

  ASSERT_EQ(0, uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  ASSERT_EQ(0, uv_udp_init_ex(uv_default_loop(), &recver,
                              AF_UNSPEC | UV_UDP_RECVMMSG));

  ASSERT_EQ(0, uv_udp_bind(&recver, (const struct sockaddr*) &addr, 0));

  ASSERT_EQ(0, uv_udp_recv_start(&recver, alloc_cb, recv_cb));

  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_EQ(0, uv_udp_init(uv_default_loop(), &sender));

  buf = uv_buf_init("PING", 4);
  for (i = 0; i < NUM_SENDS; i++) {
    ASSERT_EQ(4, uv_udp_try_send(&sender, &buf, 1, (const struct sockaddr*) &addr));
  }

  ASSERT_EQ(0, uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(close_cb_called, 2);
  ASSERT_EQ(recv_cb_called, NUM_SENDS);

  ASSERT_EQ(sender.send_queue_size, 0);
  ASSERT_EQ(recver.send_queue_size, 0);

  printf("%d allocs for %d recvs\n", alloc_cb_called, recv_cb_called);

  /* On platforms that don't support mmsg, each recv gets its own alloc */
  if (uv_udp_using_recvmmsg(&recver))
    ASSERT_EQ(alloc_cb_called, EXPECTED_MMSG_ALLOCS);
  else
    ASSERT_EQ(alloc_cb_called, recv_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}